

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::TextureSizeVariants::TextureSizeVariants(TextureSizeVariants *this)

{
  long lVar1;
  long lVar2;
  uint64_t (*pauVar3) [4];
  
  this->srv = 0;
  pauVar3 = this->uav;
  lVar1 = 8;
  while (lVar1 != 0x68) {
    lVar1 = lVar1 + 0x20;
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
      *(undefined8 *)((long)*pauVar3 + lVar2) = 0;
    }
    pauVar3 = pauVar3 + 1;
  }
  return;
}

Assistant:

TextureSizeVariants()
		{
			srv = 0;
			for (auto &unorm : uav)
				for (auto &u : unorm)
					u = 0;
		}